

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::TestEventRepeater::OnTestIterationStart
          (TestEventRepeater *this,UnitTest *unit_test,int iteration)

{
  pointer ppTVar1;
  ulong uVar2;
  
  if ((this->forwarding_enabled_ == true) &&
     (ppTVar1 = (this->listeners_).
                super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (this->listeners_).
     super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
     ._M_impl.super__Vector_impl_data._M_finish != ppTVar1)) {
    uVar2 = 0;
    do {
      (*ppTVar1[uVar2]->_vptr_TestEventListener[3])(ppTVar1[uVar2],unit_test,(ulong)(uint)iteration)
      ;
      uVar2 = uVar2 + 1;
      ppTVar1 = (this->listeners_).
                super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->listeners_).
                                   super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3))
    ;
  }
  return;
}

Assistant:

void TestEventRepeater::OnTestIterationStart(const UnitTest& unit_test,
                                             int iteration) {
  if (forwarding_enabled_) {
    for (size_t i = 0; i < listeners_.size(); i++) {
      listeners_[i]->OnTestIterationStart(unit_test, iteration);
    }
  }
}